

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

void __thiscall
Jupiter::HTTP::Server::Content::Content(Content *this,string *in_name,HTTPFunction *in_function)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  undefined8 uVar5;
  uint uVar6;
  size_type sVar7;
  
  this->_vptr_Content = (_func_int **)&PTR_execute_abi_cxx11__00146350;
  this->free_result = true;
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (in_name->_M_dataplus)._M_p;
  paVar2 = &in_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&in_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar5;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = in_name->_M_string_length;
  (in_name->_M_dataplus)._M_p = (pointer)paVar2;
  in_name->_M_string_length = 0;
  (in_name->field_2)._M_local_buf[0] = '\0';
  (this->charset)._M_len = 0;
  (this->charset)._M_str = (char *)0x0;
  (this->type)._M_len = 0;
  (this->type)._M_str = (char *)0x0;
  (this->language)._M_len = 0;
  (this->language)._M_str = (char *)0x0;
  this->function = in_function;
  sVar4 = (this->name)._M_string_length;
  if (sVar4 == 0) {
    uVar6 = 0;
  }
  else {
    sVar7 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + (int)(this->name)._M_dataplus._M_p[sVar7];
      sVar7 = sVar7 + 1;
    } while (sVar4 != sVar7);
  }
  this->name_checksum = uVar6;
  return;
}

Assistant:

Jupiter::HTTP::Server::Content::Content(std::string in_name, Jupiter::HTTP::Server::HTTPFunction in_function)
	: name(std::move(in_name)) {
	Jupiter::HTTP::Server::Content::function = in_function;
	Jupiter::HTTP::Server::Content::name_checksum = calc_checksum(name); // switch to calcChecksumi to make case-insensitive
}